

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_jnt_convolve_avx2.c
# Opt level: O3

void av1_highbd_dist_wtd_convolve_x_avx2
               (uint16_t *src,int src_stride,uint16_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params,
               int bd)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  CONV_BUF_TYPE *pCVar4;
  int16_t *piVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  char cVar9;
  undefined2 uVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  uint16_t *puVar19;
  CONV_BUF_TYPE *pCVar20;
  CONV_BUF_TYPE *pCVar21;
  int iVar22;
  long lVar23;
  undefined2 uVar24;
  uint16_t *puVar25;
  uint uVar26;
  uint16_t *puVar27;
  long lVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [32];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [32];
  undefined1 auVar41 [64];
  undefined1 auVar42 [32];
  undefined1 auVar43 [64];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  
  iVar22 = conv_params->round_0 + conv_params->round_1;
  cVar9 = (char)bd - (char)iVar22;
  uVar24 = 0xff;
  if (bd == 0xc) {
    uVar24 = 0xfff;
  }
  uVar10 = 0x3ff;
  if (bd != 10) {
    uVar10 = uVar24;
  }
  if (0 < w) {
    pCVar4 = conv_params->dst;
    iVar17 = (1 << ((byte)conv_params->round_0 & 0x1f)) >> 1;
    uVar16 = (ulong)((subpel_x_qn & 0xfU) * (uint)filter_params_x->taps);
    uVar26 = (uint)(filter_params_x->taps >> 1);
    auVar30 = ZEXT464(7 - conv_params->round_1);
    iVar1 = conv_params->fwd_offset;
    iVar2 = conv_params->bck_offset;
    auVar35 = ZEXT3264(CONCAT428(iVar17,CONCAT424(iVar17,CONCAT420(iVar17,CONCAT416(iVar17,CONCAT412
                                                  (iVar17,CONCAT48(iVar17,CONCAT44(iVar17,iVar17))))
                                                  ))));
    auVar36 = ZEXT464((uint)conv_params->round_0);
    iVar14 = (1 << (cVar9 + 0xdU & 0x1f)) + (1 << (cVar9 + 0xeU & 0x1f));
    auVar38 = ZEXT3264(CONCAT428(iVar14,CONCAT424(iVar14,CONCAT420(iVar14,CONCAT416(iVar14,CONCAT412
                                                  (iVar14,CONCAT48(iVar14,CONCAT44(iVar14,iVar14))))
                                                  ))));
    uVar12 = 0xe - iVar22;
    auVar39 = ZEXT3264(CONCAT230(uVar10,CONCAT228(uVar10,CONCAT226(uVar10,CONCAT224(uVar10,CONCAT222
                                                  (uVar10,CONCAT220(uVar10,CONCAT218(uVar10,
                                                  CONCAT216(uVar10,CONCAT214(uVar10,CONCAT212(uVar10
                                                  ,CONCAT210(uVar10,CONCAT28(uVar10,CONCAT26(uVar10,
                                                  CONCAT24(uVar10,CONCAT22(uVar10,uVar10))))))))))))
                                                  ))));
    piVar5 = filter_params_x->filter_ptr;
    uVar3 = *(undefined4 *)(piVar5 + uVar16 + 6);
    auVar41 = ZEXT3264(CONCAT428(uVar3,CONCAT424(uVar3,CONCAT420(uVar3,CONCAT416(uVar3,CONCAT412(
                                                  uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))))))));
    uVar3 = *(undefined4 *)(piVar5 + uVar16 + 4);
    auVar43 = ZEXT3264(CONCAT428(uVar3,CONCAT424(uVar3,CONCAT420(uVar3,CONCAT416(uVar3,CONCAT412(
                                                  uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))))))));
    uVar3 = *(undefined4 *)(piVar5 + uVar16 + 2);
    auVar45 = ZEXT3264(CONCAT428(uVar3,CONCAT424(uVar3,CONCAT420(uVar3,CONCAT416(uVar3,CONCAT412(
                                                  uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))))))));
    uVar3 = *(undefined4 *)(piVar5 + uVar16);
    auVar46._4_4_ = uVar3;
    auVar46._0_4_ = uVar3;
    auVar46._8_4_ = uVar3;
    auVar46._12_4_ = uVar3;
    auVar46._16_4_ = uVar3;
    auVar46._20_4_ = uVar3;
    auVar46._24_4_ = uVar3;
    auVar46._28_4_ = uVar3;
    lVar23 = (long)conv_params->dst_stride;
    iVar22 = conv_params->do_average;
    iVar17 = conv_params->use_dist_wtd_comp_avg;
    iVar14 = ((1 << ((byte)uVar12 & 0x1f)) >> 1) - iVar14;
    auVar47 = ZEXT3264(CONCAT428(iVar14,CONCAT424(iVar14,CONCAT420(iVar14,CONCAT416(iVar14,CONCAT412
                                                  (iVar14,CONCAT48(iVar14,CONCAT44(iVar14,iVar14))))
                                                  ))));
    lVar18 = (long)src_stride;
    lVar11 = (long)dst_stride0;
    lVar15 = 0;
    uVar16 = 0;
    do {
      if (0 < h) {
        lVar13 = 0;
        puVar19 = dst0 + lVar11;
        pCVar20 = pCVar4;
        pCVar21 = pCVar4 + lVar23;
        puVar25 = dst0;
        puVar27 = src + (1 - (ulong)uVar26);
        lVar28 = (long)src + (lVar18 * 2 - (ulong)(uVar26 * 2)) + 2;
        do {
          auVar7 = vperm2i128_avx2(*(undefined1 (*) [32])((long)puVar27 + lVar15),
                                   *(undefined1 (*) [32])(lVar28 + lVar15),0x20);
          auVar8 = vperm2i128_avx2(*(undefined1 (*) [32])((long)puVar27 + lVar15),
                                   *(undefined1 (*) [32])(lVar28 + lVar15),0x31);
          auVar48 = vpalignr_avx2(auVar8,auVar7,4);
          auVar31 = vpalignr_avx2(auVar8,auVar7,8);
          auVar32 = vpalignr_avx2(auVar8,auVar7,0xc);
          auVar37 = vpmaddwd_avx2(auVar7,auVar46);
          auVar44 = auVar45._0_32_;
          auVar49 = vpmaddwd_avx2(auVar48,auVar44);
          auVar42 = auVar43._0_32_;
          auVar48 = vpmaddwd_avx2(auVar31,auVar42);
          auVar40 = auVar41._0_32_;
          auVar31 = vpmaddwd_avx2(auVar32,auVar40);
          auVar48 = vpaddd_avx2(auVar48,auVar31);
          auVar34 = auVar35._0_32_;
          auVar31 = vpaddd_avx2(auVar37,auVar34);
          auVar31 = vpaddd_avx2(auVar49,auVar31);
          auVar48 = vpaddd_avx2(auVar31,auVar48);
          auVar33 = auVar36._0_16_;
          auVar6 = vpsrad_avx2(auVar48,auVar33);
          auVar48 = vpalignr_avx2(auVar8,auVar7,2);
          auVar31 = vpalignr_avx2(auVar8,auVar7,6);
          auVar32 = vpalignr_avx2(auVar8,auVar7,10);
          auVar37 = vpalignr_avx2(auVar8,auVar7,0xe);
          auVar49 = vpmaddwd_avx2(auVar46,auVar48);
          auVar48 = vpmaddwd_avx2(auVar31,auVar44);
          auVar31 = vpmaddwd_avx2(auVar32,auVar42);
          auVar48 = vpaddd_avx2(auVar48,auVar31);
          auVar32 = vpmaddwd_avx2(auVar37,auVar40);
          auVar31 = vpaddd_avx2(auVar49,auVar34);
          auVar48 = vpaddd_avx2(auVar48,auVar31);
          auVar48 = vpaddd_avx2(auVar32,auVar48);
          auVar48 = vpsrad_avx2(auVar48,auVar33);
          auVar29 = auVar30._0_16_;
          auVar31 = vpslld_avx2(auVar6,auVar29);
          auVar32 = vpslld_avx2(auVar48,auVar29);
          auVar48 = vpunpckldq_avx2(auVar31,auVar32);
          auVar37 = auVar38._0_32_;
          auVar48 = vpaddd_avx2(auVar48,auVar37);
          if ((long)((ulong)(uint)w - 8) < (long)uVar16) {
            if (iVar22 == 0) {
              auVar48 = vpackusdw_avx2(auVar48,auVar30._0_32_);
              *(long *)((long)pCVar20 + lVar15) = auVar48._0_8_;
              *(long *)((long)pCVar21 + lVar15) = auVar48._16_8_;
            }
            else {
              auVar29._8_8_ = 0;
              auVar29._0_8_ = *(ulong *)((long)pCVar21 + lVar15);
              auVar33._8_8_ = 0;
              auVar33._0_8_ = *(ulong *)((long)pCVar20 + lVar15);
              auVar31._0_16_ = ZEXT116(0) * auVar29 + ZEXT116(1) * auVar33;
              auVar31._16_16_ = ZEXT116(1) * auVar29;
              auVar31 = vpunpcklwd_avx2(auVar31,_DAT_0050f2c0);
              if (iVar17 == 0) {
                auVar48 = vpaddd_avx2(auVar48,auVar31);
                auVar48 = vpsrad_avx2(auVar48,1);
              }
              else {
                auVar49._4_4_ = iVar1;
                auVar49._0_4_ = iVar1;
                auVar49._8_4_ = iVar1;
                auVar49._12_4_ = iVar1;
                auVar49._16_4_ = iVar1;
                auVar49._20_4_ = iVar1;
                auVar49._24_4_ = iVar1;
                auVar49._28_4_ = iVar1;
                auVar31 = vpmulld_avx2(auVar31,auVar49);
                auVar37._4_4_ = iVar2;
                auVar37._0_4_ = iVar2;
                auVar37._8_4_ = iVar2;
                auVar37._12_4_ = iVar2;
                auVar37._16_4_ = iVar2;
                auVar37._20_4_ = iVar2;
                auVar37._24_4_ = iVar2;
                auVar37._28_4_ = iVar2;
                auVar48 = vpmulld_avx2(auVar48,auVar37);
                auVar48 = vpaddd_avx2(auVar31,auVar48);
                auVar48 = vpsrad_avx2(auVar48,4);
              }
              auVar48 = vpaddd_avx2(auVar47._0_32_,auVar48);
              auVar48 = vpsrad_avx2(auVar48,ZEXT416(uVar12));
              auVar48 = vpackusdw_avx2(auVar48,auVar48);
              auVar48 = vpminsw_avx2(auVar48,auVar39._0_32_);
              *(long *)((long)puVar25 + lVar15) = auVar48._0_8_;
              *(long *)((long)puVar19 + lVar15) = auVar48._16_8_;
            }
          }
          else {
            auVar31 = vpunpckhdq_avx2(auVar31,auVar32);
            auVar31 = vpaddd_avx2(auVar31,auVar37);
            if (iVar22 == 0) {
              auVar48 = vpackusdw_avx2(auVar48,auVar31);
              *(undefined1 (*) [16])((long)pCVar20 + lVar15) = auVar48._0_16_;
              *(undefined1 (*) [16])((long)pCVar21 + lVar15) = auVar48._16_16_;
            }
            else {
              auVar32._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])((long)pCVar21 + lVar15) +
                   ZEXT116(1) * *(undefined1 (*) [16])((long)pCVar20 + lVar15);
              auVar32._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])((long)pCVar21 + lVar15);
              auVar49 = vpunpcklwd_avx2(auVar32,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
              auVar32 = vpunpckhwd_avx2(auVar32,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
              if (iVar17 == 0) {
                auVar48 = vpaddd_avx2(auVar48,auVar49);
                auVar49 = vpsrad_avx2(auVar48,1);
                auVar48 = vpaddd_avx2(auVar31,auVar32);
                auVar48 = vpsrad_avx2(auVar48,1);
              }
              else {
                auVar7._4_4_ = iVar1;
                auVar7._0_4_ = iVar1;
                auVar7._8_4_ = iVar1;
                auVar7._12_4_ = iVar1;
                auVar7._16_4_ = iVar1;
                auVar7._20_4_ = iVar1;
                auVar7._24_4_ = iVar1;
                auVar7._28_4_ = iVar1;
                auVar49 = vpmulld_avx2(auVar7,auVar49);
                auVar6._4_4_ = iVar2;
                auVar6._0_4_ = iVar2;
                auVar6._8_4_ = iVar2;
                auVar6._12_4_ = iVar2;
                auVar6._16_4_ = iVar2;
                auVar6._20_4_ = iVar2;
                auVar6._24_4_ = iVar2;
                auVar6._28_4_ = iVar2;
                auVar48 = vpmulld_avx2(auVar48,auVar6);
                auVar48 = vpaddd_avx2(auVar49,auVar48);
                auVar49 = vpsrad_avx2(auVar48,4);
                auVar48 = vpmulld_avx2(auVar7,auVar32);
                auVar39 = ZEXT3264(auVar39._0_32_);
                auVar47 = ZEXT3264(auVar47._0_32_);
                auVar38 = ZEXT3264(auVar37);
                auVar30 = ZEXT1664(auVar29);
                auVar35 = ZEXT3264(auVar34);
                auVar36 = ZEXT1664(auVar33);
                auVar41 = ZEXT3264(auVar40);
                auVar43 = ZEXT3264(auVar42);
                auVar45 = ZEXT3264(auVar44);
                auVar31 = vpmulld_avx2(auVar31,auVar6);
                auVar48 = vpaddd_avx2(auVar48,auVar31);
                auVar48 = vpsrad_avx2(auVar48,4);
              }
              auVar31 = vpaddd_avx2(auVar47._0_32_,auVar49);
              auVar31 = vpsrad_avx2(auVar31,ZEXT416(uVar12));
              auVar48 = vpaddd_avx2(auVar47._0_32_,auVar48);
              auVar48 = vpsrad_avx2(auVar48,ZEXT416(uVar12));
              auVar48 = vpackusdw_avx2(auVar31,auVar48);
              auVar48 = vpminsw_avx2(auVar48,auVar39._0_32_);
              *(undefined1 (*) [16])((long)puVar25 + lVar15) = auVar48._0_16_;
              *(undefined1 (*) [16])((long)puVar19 + lVar15) = auVar48._16_16_;
            }
          }
          lVar13 = lVar13 + 2;
          lVar28 = lVar28 + lVar18 * 4;
          pCVar21 = pCVar21 + lVar23 * 2;
          pCVar20 = pCVar20 + lVar23 * 2;
          puVar19 = puVar19 + lVar11 * 2;
          puVar25 = puVar25 + lVar11 * 2;
          puVar27 = puVar27 + lVar18 * 2;
        } while (lVar13 < h);
      }
      uVar16 = uVar16 + 8;
      lVar15 = lVar15 + 0x10;
    } while (uVar16 < (uint)w);
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_x_avx2(
    const uint16_t *src, int src_stride, uint16_t *dst0, int dst_stride0, int w,
    int h, const InterpFilterParams *filter_params_x, const int subpel_x_qn,
    ConvolveParams *conv_params, int bd) {
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_horiz;
  const int bits = FILTER_BITS - conv_params->round_1;

  int i, j;
  __m256i s[4], coeffs_x[4];

  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m256i wt0 = _mm256_set1_epi32(w0);
  const __m256i wt1 = _mm256_set1_epi32(w1);
  const __m256i zero = _mm256_setzero_si256();

  const __m256i round_const_x =
      _mm256_set1_epi32(((1 << conv_params->round_0) >> 1));
  const __m128i round_shift_x = _mm_cvtsi32_si128(conv_params->round_0);
  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);

  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m256i offset_const = _mm256_set1_epi32(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m256i rounding_const = _mm256_set1_epi32((1 << rounding_shift) >> 1);
  const __m256i clip_pixel_to_bd =
      _mm256_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));

  assert(bits >= 0);
  prepare_coeffs(filter_params_x, subpel_x_qn, coeffs_x);

  for (j = 0; j < w; j += 8) {
    /* Horizontal filter */
    for (i = 0; i < h; i += 2) {
      const __m256i row0 =
          _mm256_loadu_si256((__m256i *)&src_ptr[i * src_stride + j]);
      __m256i row1 =
          _mm256_loadu_si256((__m256i *)&src_ptr[(i + 1) * src_stride + j]);

      const __m256i r0 = _mm256_permute2x128_si256(row0, row1, 0x20);
      const __m256i r1 = _mm256_permute2x128_si256(row0, row1, 0x31);

      // even pixels
      s[0] = _mm256_alignr_epi8(r1, r0, 0);
      s[1] = _mm256_alignr_epi8(r1, r0, 4);
      s[2] = _mm256_alignr_epi8(r1, r0, 8);
      s[3] = _mm256_alignr_epi8(r1, r0, 12);

      __m256i res_even = convolve(s, coeffs_x);
      res_even = _mm256_sra_epi32(_mm256_add_epi32(res_even, round_const_x),
                                  round_shift_x);

      // odd pixels
      s[0] = _mm256_alignr_epi8(r1, r0, 2);
      s[1] = _mm256_alignr_epi8(r1, r0, 6);
      s[2] = _mm256_alignr_epi8(r1, r0, 10);
      s[3] = _mm256_alignr_epi8(r1, r0, 14);

      __m256i res_odd = convolve(s, coeffs_x);
      res_odd = _mm256_sra_epi32(_mm256_add_epi32(res_odd, round_const_x),
                                 round_shift_x);

      res_even = _mm256_sll_epi32(res_even, round_shift_bits);
      res_odd = _mm256_sll_epi32(res_odd, round_shift_bits);

      __m256i res1 = _mm256_unpacklo_epi32(res_even, res_odd);

      __m256i res_unsigned_lo = _mm256_add_epi32(res1, offset_const);

      if (w - j < 8) {
        if (do_average) {
          const __m256i data_0 = _mm256_castsi128_si256(
              _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j])));
          const __m256i data_1 = _mm256_castsi128_si256(_mm_loadl_epi64(
              (__m128i *)(&dst[i * dst_stride + j + dst_stride])));
          const __m256i data_01 =
              _mm256_permute2x128_si256(data_0, data_1, 0x20);

          const __m256i data_ref_0 = _mm256_unpacklo_epi16(data_01, zero);

          const __m256i comp_avg_res = highbd_comp_avg(
              &data_ref_0, &res_unsigned_lo, &wt0, &wt1, use_dist_wtd_comp_avg);

          const __m256i round_result = highbd_convolve_rounding(
              &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

          const __m256i res_16b =
              _mm256_packus_epi32(round_result, round_result);
          const __m256i res_clip = _mm256_min_epi16(res_16b, clip_pixel_to_bd);

          const __m128i res_0 = _mm256_castsi256_si128(res_clip);
          const __m128i res_1 = _mm256_extracti128_si256(res_clip, 1);

          _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
          _mm_storel_epi64(
              (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]), res_1);
        } else {
          __m256i res_16b =
              _mm256_packus_epi32(res_unsigned_lo, res_unsigned_lo);
          const __m128i res_0 = _mm256_castsi256_si128(res_16b);
          const __m128i res_1 = _mm256_extracti128_si256(res_16b, 1);

          _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j]), res_0);
          _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                           res_1);
        }
      } else {
        __m256i res2 = _mm256_unpackhi_epi32(res_even, res_odd);
        __m256i res_unsigned_hi = _mm256_add_epi32(res2, offset_const);

        if (do_average) {
          const __m256i data_0 = _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j])));
          const __m256i data_1 = _mm256_castsi128_si256(_mm_loadu_si128(
              (__m128i *)(&dst[i * dst_stride + j + dst_stride])));
          const __m256i data_01 =
              _mm256_permute2x128_si256(data_0, data_1, 0x20);

          const __m256i data_ref_0_lo = _mm256_unpacklo_epi16(data_01, zero);
          const __m256i data_ref_0_hi = _mm256_unpackhi_epi16(data_01, zero);

          const __m256i comp_avg_res_lo =
              highbd_comp_avg(&data_ref_0_lo, &res_unsigned_lo, &wt0, &wt1,
                              use_dist_wtd_comp_avg);
          const __m256i comp_avg_res_hi =
              highbd_comp_avg(&data_ref_0_hi, &res_unsigned_hi, &wt0, &wt1,
                              use_dist_wtd_comp_avg);

          const __m256i round_result_lo = highbd_convolve_rounding(
              &comp_avg_res_lo, &offset_const, &rounding_const, rounding_shift);
          const __m256i round_result_hi = highbd_convolve_rounding(
              &comp_avg_res_hi, &offset_const, &rounding_const, rounding_shift);

          const __m256i res_16b =
              _mm256_packus_epi32(round_result_lo, round_result_hi);
          const __m256i res_clip = _mm256_min_epi16(res_16b, clip_pixel_to_bd);

          const __m128i res_0 = _mm256_castsi256_si128(res_clip);
          const __m128i res_1 = _mm256_extracti128_si256(res_clip, 1);

          _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
          _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]),
                          res_1);
        } else {
          __m256i res_16b =
              _mm256_packus_epi32(res_unsigned_lo, res_unsigned_hi);
          const __m128i res_0 = _mm256_castsi256_si128(res_16b);
          const __m128i res_1 = _mm256_extracti128_si256(res_16b, 1);

          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_0);
          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                          res_1);
        }
      }
    }
  }
}